

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_backup * sqlite3_backup_init(sqlite3 *pDestDb,char *zDestDb,sqlite3 *pSrcDb,char *zSrcDb)

{
  int iVar1;
  Btree *pBVar2;
  sqlite3_backup *local_30;
  sqlite3_backup *p;
  char *zSrcDb_local;
  sqlite3 *pSrcDb_local;
  char *zDestDb_local;
  sqlite3 *pDestDb_local;
  
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3_mutex_enter(pDestDb->mutex);
  if (pSrcDb == pDestDb) {
    sqlite3ErrorWithMsg(pDestDb,1,"source and destination must be distinct");
    local_30 = (sqlite3_backup *)0x0;
  }
  else {
    local_30 = (sqlite3_backup *)sqlite3MallocZero(0x48);
    if (local_30 == (sqlite3_backup *)0x0) {
      sqlite3Error(pDestDb,7);
    }
  }
  if (local_30 != (sqlite3_backup *)0x0) {
    pBVar2 = findBtree(pDestDb,pSrcDb,zSrcDb);
    local_30->pSrc = pBVar2;
    pBVar2 = findBtree(pDestDb,pDestDb,zDestDb);
    local_30->pDest = pBVar2;
    local_30->pDestDb = pDestDb;
    local_30->pSrcDb = pSrcDb;
    local_30->iNext = 1;
    local_30->isAttached = 0;
    if (((local_30->pSrc == (Btree *)0x0) || (local_30->pDest == (Btree *)0x0)) ||
       (iVar1 = checkReadTransaction(pDestDb,local_30->pDest), iVar1 != 0)) {
      sqlite3_free(local_30);
      local_30 = (sqlite3_backup *)0x0;
    }
  }
  if (local_30 != (sqlite3_backup *)0x0) {
    local_30->pSrc->nBackup = local_30->pSrc->nBackup + 1;
  }
  sqlite3_mutex_leave(pDestDb->mutex);
  sqlite3_mutex_leave(pSrcDb->mutex);
  return local_30;
}

Assistant:

SQLITE_API sqlite3_backup *sqlite3_backup_init(
  sqlite3* pDestDb,                     /* Database to write to */
  const char *zDestDb,                  /* Name of database within pDestDb */
  sqlite3* pSrcDb,                      /* Database connection to read from */
  const char *zSrcDb                    /* Name of database within pSrcDb */
){
  sqlite3_backup *p;                    /* Value to return */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(pSrcDb)||!sqlite3SafetyCheckOk(pDestDb) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  /* Lock the source database handle. The destination database
  ** handle is not locked in this routine, but it is locked in
  ** sqlite3_backup_step(). The user is required to ensure that no
  ** other thread accesses the destination handle for the duration
  ** of the backup operation.  Any attempt to use the destination
  ** database connection while a backup is in progress may cause
  ** a malfunction or a deadlock.
  */
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3_mutex_enter(pDestDb->mutex);

  if( pSrcDb==pDestDb ){
    sqlite3ErrorWithMsg(
        pDestDb, SQLITE_ERROR, "source and destination must be distinct"
    );
    p = 0;
  }else {
    /* Allocate space for a new sqlite3_backup object...
    ** EVIDENCE-OF: R-64852-21591 The sqlite3_backup object is created by a
    ** call to sqlite3_backup_init() and is destroyed by a call to
    ** sqlite3_backup_finish(). */
    p = (sqlite3_backup *)sqlite3MallocZero(sizeof(sqlite3_backup));
    if( !p ){
      sqlite3Error(pDestDb, SQLITE_NOMEM_BKPT);
    }
  }

  /* If the allocation succeeded, populate the new object. */
  if( p ){
    p->pSrc = findBtree(pDestDb, pSrcDb, zSrcDb);
    p->pDest = findBtree(pDestDb, pDestDb, zDestDb);
    p->pDestDb = pDestDb;
    p->pSrcDb = pSrcDb;
    p->iNext = 1;
    p->isAttached = 0;

    if( 0==p->pSrc || 0==p->pDest
     || checkReadTransaction(pDestDb, p->pDest)!=SQLITE_OK
     ){
      /* One (or both) of the named databases did not exist or an OOM
      ** error was hit. Or there is a transaction open on the destination
      ** database. The error has already been written into the pDestDb
      ** handle. All that is left to do here is free the sqlite3_backup
      ** structure.  */
      sqlite3_free(p);
      p = 0;
    }
  }
  if( p ){
    p->pSrc->nBackup++;
  }

  sqlite3_mutex_leave(pDestDb->mutex);
  sqlite3_mutex_leave(pSrcDb->mutex);
  return p;
}